

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

value * __thiscall
mjs::interpreter::impl::top_level_eval
          (value *__return_storage_ptr__,impl *this,statement *s,bool allow_return)

{
  wostream *os;
  native_error_exception *this_00;
  value *rhs;
  completion c;
  wostringstream woss;
  wstring local_238;
  wstring_view local_218;
  wchar_t *local_208;
  size_t local_200;
  undefined1 local_1e8 [64];
  wstring_view local_1a8;
  wostringstream local_198 [376];
  
  eval((completion *)local_1e8,this,s);
  if (local_1e8._0_4_ == throw_) {
    if (local_1e8._8_4_ == object) {
      rethrow_error((object_ptr *)(local_1e8 + 0x10));
    }
    __assert_fail("c.result.type() == value_type::object",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x1ab,"value mjs::interpreter::impl::top_level_eval(const statement &, bool)");
  }
  if (allow_return && local_1e8._0_4_ == return_) {
    rhs = (value *)(local_1e8 + 8);
  }
  else {
    if (local_1e8._0_4_ != normal) {
      std::__cxx11::wostringstream::wostringstream(local_198);
      os = std::operator<<((wostream *)local_198,
                           "Top level evaluation resulted in abrupt termination: ");
      mjs::operator<<(os,(completion *)local_1e8);
      this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
      stack_trace_abi_cxx11_(&local_238,this);
      local_218._M_len = local_238._M_string_length;
      local_218._M_str = local_238._M_dataplus._M_p;
      std::__cxx11::wstringbuf::str();
      local_1a8._M_len = local_200;
      local_1a8._M_str = local_208;
      native_error_exception::native_error_exception(this_00,eval,&local_218,&local_1a8);
      __cxa_throw(this_00,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
    rhs = (value *)&value::undefined;
  }
  value::value(__return_storage_ptr__,rhs);
  value::destroy((value *)(local_1e8 + 8));
  return __return_storage_ptr__;
}

Assistant:

value top_level_eval(const statement& s, bool allow_return = true) {
        auto c = eval(s);
        // ES3, 13.2.1 [[Call]]
        if (c.type == completion_type::throw_) {
            assert(c.result.type() == value_type::object);
            rethrow_error(c.result.object_value());
        } else if  (allow_return && c.type == completion_type::return_) {
            return c.result;
        } else if (!c) {
            // Don't let normal completion values escape
            return value::undefined;
        }
        std::wostringstream woss;
        woss << "Top level evaluation resulted in abrupt termination: " << c;
        throw native_error_exception(native_error_type::eval, stack_trace(), woss.str());
    }